

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O3

string * http_errorstring_abi_cxx11_(string *__return_storage_ptr__,int code)

{
  long lVar1;
  string *extraout_RAX;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(code) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_001259f8:
      __stack_chk_fail();
    }
    pcVar3 = "timeout reached";
    pcVar2 = "";
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001259f8;
    pcVar3 = "EOF reached";
    pcVar2 = "";
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001259f8;
    pcVar3 = "error while reading header, or invalid header";
    pcVar2 = "";
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001259f8;
    pcVar3 = "error encountered while reading or writing";
    pcVar2 = "";
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001259f8;
    pcVar3 = "request was canceled";
    pcVar2 = "";
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001259f8;
    pcVar3 = "response body is larger than allowed";
    pcVar2 = "";
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_001259f8;
    pcVar3 = "unknown";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return extraout_RAX;
}

Assistant:

static std::string http_errorstring(int code)
{
    switch(code) {
    case EVREQ_HTTP_TIMEOUT:
        return "timeout reached";
    case EVREQ_HTTP_EOF:
        return "EOF reached";
    case EVREQ_HTTP_INVALID_HEADER:
        return "error while reading header, or invalid header";
    case EVREQ_HTTP_BUFFER_ERROR:
        return "error encountered while reading or writing";
    case EVREQ_HTTP_REQUEST_CANCEL:
        return "request was canceled";
    case EVREQ_HTTP_DATA_TOO_LONG:
        return "response body is larger than allowed";
    default:
        return "unknown";
    }
}